

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O0

IOTHUB_MESSAGE_HANDLE IoTHubMessage_Clone(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA_HANDLE pIVar3;
  BUFFER_HANDLE pBVar4;
  MAP_HANDLE pMVar5;
  STRING_HANDLE pSVar6;
  LOGGER_LOG l_17;
  LOGGER_LOG l_16;
  LOGGER_LOG l_15;
  LOGGER_LOG l_14;
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_MESSAGE_HANDLE_DATA *source;
  IOTHUB_MESSAGE_HANDLE_DATA *result;
  IOTHUB_MESSAGE_HANDLE iotHubMessageHandle_local;
  
  if (iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) {
    source = (IOTHUB_MESSAGE_HANDLE_DATA *)0x0;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_Clone",0x14e,1,
                "iotHubMessageHandle parameter cannot be NULL for IoTHubMessage_Clone");
    }
  }
  else {
    source = (IOTHUB_MESSAGE_HANDLE_DATA *)malloc(0x90);
    if (source == (IOTHUB_MESSAGE_HANDLE_DATA *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                  ,"IoTHubMessage_Clone",0x156,1,"unable to malloc");
      }
    }
    else {
      memset(source,0,0x90);
      source->contentType = iotHubMessageHandle->contentType;
      source->is_security_message = (_Bool)(iotHubMessageHandle->is_security_message & 1);
      if ((iotHubMessageHandle->messageId == (char *)0x0) ||
         (iVar1 = mallocAndStrcpy_s(&source->messageId,iotHubMessageHandle->messageId), iVar1 == 0))
      {
        if ((iotHubMessageHandle->correlationId == (char *)0x0) ||
           (iVar1 = mallocAndStrcpy_s(&source->correlationId,iotHubMessageHandle->correlationId),
           iVar1 == 0)) {
          if ((iotHubMessageHandle->userDefinedContentType == (char *)0x0) ||
             (iVar1 = mallocAndStrcpy_s(&source->userDefinedContentType,
                                        iotHubMessageHandle->userDefinedContentType), iVar1 == 0)) {
            if ((iotHubMessageHandle->contentEncoding == (char *)0x0) ||
               (iVar1 = mallocAndStrcpy_s(&source->contentEncoding,
                                          iotHubMessageHandle->contentEncoding), iVar1 == 0)) {
              if (iotHubMessageHandle->diagnosticData !=
                  (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA_HANDLE)0x0) {
                pIVar3 = CloneDiagnosticPropertyData(iotHubMessageHandle->diagnosticData);
                source->diagnosticData = pIVar3;
                if (pIVar3 == (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA_HANDLE)0x0) {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                              ,"IoTHubMessage_Clone",0x178,1,
                              "unable to copy CloneDiagnosticPropertyData");
                  }
                  DestroyMessageData(source);
                  return (IOTHUB_MESSAGE_HANDLE)0x0;
                }
              }
              if ((iotHubMessageHandle->outputName == (char *)0x0) ||
                 (iVar1 = mallocAndStrcpy_s(&source->outputName,iotHubMessageHandle->outputName),
                 iVar1 == 0)) {
                if ((iotHubMessageHandle->inputName == (char *)0x0) ||
                   (iVar1 = mallocAndStrcpy_s(&source->inputName,iotHubMessageHandle->inputName),
                   iVar1 == 0)) {
                  if ((iotHubMessageHandle->creationTimeUtc == (char *)0x0) ||
                     (iVar1 = mallocAndStrcpy_s(&source->creationTimeUtc,
                                                iotHubMessageHandle->creationTimeUtc), iVar1 == 0))
                  {
                    if ((iotHubMessageHandle->userId == (char *)0x0) ||
                       (iVar1 = mallocAndStrcpy_s(&source->userId,iotHubMessageHandle->userId),
                       iVar1 == 0)) {
                      if ((iotHubMessageHandle->connectionModuleId == (char *)0x0) ||
                         (iVar1 = mallocAndStrcpy_s(&source->connectionModuleId,
                                                    iotHubMessageHandle->connectionModuleId),
                         iVar1 == 0)) {
                        if ((iotHubMessageHandle->connectionDeviceId == (char *)0x0) ||
                           (iVar1 = mallocAndStrcpy_s(&source->connectionDeviceId,
                                                      iotHubMessageHandle->connectionDeviceId),
                           iVar1 == 0)) {
                          if ((iotHubMessageHandle->componentName == (char *)0x0) ||
                             (iVar1 = mallocAndStrcpy_s(&source->componentName,
                                                        iotHubMessageHandle->componentName),
                             iVar1 == 0)) {
                            if (iotHubMessageHandle->contentType == IOTHUBMESSAGE_BYTEARRAY) {
                              pBVar4 = BUFFER_clone((iotHubMessageHandle->value).byteArray);
                              (source->value).byteArray = pBVar4;
                              if (pBVar4 == (BUFFER_HANDLE)0x0) {
                                p_Var2 = xlogging_get_log_function();
                                if (p_Var2 != (LOGGER_LOG)0x0) {
                                  (*p_Var2)(AZ_LOG_ERROR,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                                            ,"IoTHubMessage_Clone",0x1aa,1,"unable to BUFFER_clone")
                                  ;
                                }
                                DestroyMessageData(source);
                                source = (IOTHUB_MESSAGE_HANDLE_DATA *)0x0;
                              }
                              else {
                                pMVar5 = Map_Clone(iotHubMessageHandle->properties);
                                source->properties = pMVar5;
                                if (pMVar5 == (MAP_HANDLE)0x0) {
                                  p_Var2 = xlogging_get_log_function();
                                  if (p_Var2 != (LOGGER_LOG)0x0) {
                                    (*p_Var2)(AZ_LOG_ERROR,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                                              ,"IoTHubMessage_Clone",0x1b0,1,"unable to Map_Clone");
                                  }
                                  DestroyMessageData(source);
                                  source = (IOTHUB_MESSAGE_HANDLE_DATA *)0x0;
                                }
                              }
                            }
                            else {
                              pSVar6 = STRING_clone((iotHubMessageHandle->value).string);
                              (source->value).string = pSVar6;
                              if (pSVar6 == (STRING_HANDLE)0x0) {
                                p_Var2 = xlogging_get_log_function();
                                if (p_Var2 != (LOGGER_LOG)0x0) {
                                  (*p_Var2)(AZ_LOG_ERROR,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                                            ,"IoTHubMessage_Clone",0x1b9,1,"failed to STRING_clone")
                                  ;
                                }
                                DestroyMessageData(source);
                                source = (IOTHUB_MESSAGE_HANDLE_DATA *)0x0;
                              }
                              else {
                                pMVar5 = Map_Clone(iotHubMessageHandle->properties);
                                source->properties = pMVar5;
                                if (pMVar5 == (MAP_HANDLE)0x0) {
                                  p_Var2 = xlogging_get_log_function();
                                  if (p_Var2 != (LOGGER_LOG)0x0) {
                                    (*p_Var2)(AZ_LOG_ERROR,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                                              ,"IoTHubMessage_Clone",0x1bf,1,"unable to Map_Clone");
                                  }
                                  DestroyMessageData(source);
                                  source = (IOTHUB_MESSAGE_HANDLE_DATA *)0x0;
                                }
                              }
                            }
                          }
                          else {
                            p_Var2 = xlogging_get_log_function();
                            if (p_Var2 != (LOGGER_LOG)0x0) {
                              (*p_Var2)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                                        ,"IoTHubMessage_Clone",0x1a2,1,
                                        "unable to copy componentName");
                            }
                            DestroyMessageData(source);
                            source = (IOTHUB_MESSAGE_HANDLE_DATA *)0x0;
                          }
                        }
                        else {
                          p_Var2 = xlogging_get_log_function();
                          if (p_Var2 != (LOGGER_LOG)0x0) {
                            (*p_Var2)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                                      ,"IoTHubMessage_Clone",0x19c,1,"unable to copy inputName");
                          }
                          DestroyMessageData(source);
                          source = (IOTHUB_MESSAGE_HANDLE_DATA *)0x0;
                        }
                      }
                      else {
                        p_Var2 = xlogging_get_log_function();
                        if (p_Var2 != (LOGGER_LOG)0x0) {
                          (*p_Var2)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                                    ,"IoTHubMessage_Clone",0x196,1,"unable to copy inputName");
                        }
                        DestroyMessageData(source);
                        source = (IOTHUB_MESSAGE_HANDLE_DATA *)0x0;
                      }
                    }
                    else {
                      p_Var2 = xlogging_get_log_function();
                      if (p_Var2 != (LOGGER_LOG)0x0) {
                        (*p_Var2)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                                  ,"IoTHubMessage_Clone",400,1,"unable to copy userId");
                      }
                      DestroyMessageData(source);
                      source = (IOTHUB_MESSAGE_HANDLE_DATA *)0x0;
                    }
                  }
                  else {
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      (*p_Var2)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                                ,"IoTHubMessage_Clone",0x18a,1,"unable to copy creationTimeUtc");
                    }
                    DestroyMessageData(source);
                    source = (IOTHUB_MESSAGE_HANDLE_DATA *)0x0;
                  }
                }
                else {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                              ,"IoTHubMessage_Clone",0x184,1,"unable to copy inputName");
                  }
                  DestroyMessageData(source);
                  source = (IOTHUB_MESSAGE_HANDLE_DATA *)0x0;
                }
              }
              else {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                            ,"IoTHubMessage_Clone",0x17e,1,"unable to copy outputName");
                }
                DestroyMessageData(source);
                source = (IOTHUB_MESSAGE_HANDLE_DATA *)0x0;
              }
            }
            else {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                          ,"IoTHubMessage_Clone",0x172,1,"unable to copy contentEncoding");
              }
              DestroyMessageData(source);
              source = (IOTHUB_MESSAGE_HANDLE_DATA *)0x0;
            }
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                        ,"IoTHubMessage_Clone",0x16c,1,"unable to copy contentType");
            }
            DestroyMessageData(source);
            source = (IOTHUB_MESSAGE_HANDLE_DATA *)0x0;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                      ,"IoTHubMessage_Clone",0x166,1,"unable to Copy correlationId");
          }
          DestroyMessageData(source);
          source = (IOTHUB_MESSAGE_HANDLE_DATA *)0x0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                    ,"IoTHubMessage_Clone",0x160,1,"unable to Copy messageId");
        }
        DestroyMessageData(source);
        source = (IOTHUB_MESSAGE_HANDLE_DATA *)0x0;
      }
    }
  }
  return source;
}

Assistant:

IOTHUB_MESSAGE_HANDLE IoTHubMessage_Clone(IOTHUB_MESSAGE_HANDLE iotHubMessageHandle)
{
    IOTHUB_MESSAGE_HANDLE_DATA* result;
    const IOTHUB_MESSAGE_HANDLE_DATA* source = (const IOTHUB_MESSAGE_HANDLE_DATA*)iotHubMessageHandle;
    if (source == NULL)
    {
        result = NULL;
        LogError("iotHubMessageHandle parameter cannot be NULL for IoTHubMessage_Clone");
    }
    else
    {
        result = (IOTHUB_MESSAGE_HANDLE_DATA*)malloc(sizeof(IOTHUB_MESSAGE_HANDLE_DATA));
        if (result == NULL)
        {
            /*do nothing and return as is*/
            LogError("unable to malloc");
        }
        else
        {
            memset(result, 0, sizeof(*result));
            result->contentType = source->contentType;
            result->is_security_message = source->is_security_message;

            if (source->messageId != NULL && mallocAndStrcpy_s(&result->messageId, source->messageId) != 0)
            {
                LogError("unable to Copy messageId");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->correlationId != NULL && mallocAndStrcpy_s(&result->correlationId, source->correlationId) != 0)
            {
                LogError("unable to Copy correlationId");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->userDefinedContentType != NULL && mallocAndStrcpy_s(&result->userDefinedContentType, source->userDefinedContentType) != 0)
            {
                LogError("unable to copy contentType");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->contentEncoding != NULL && mallocAndStrcpy_s(&result->contentEncoding, source->contentEncoding) != 0)
            {
                LogError("unable to copy contentEncoding");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->diagnosticData != NULL && (result->diagnosticData = CloneDiagnosticPropertyData(source->diagnosticData)) == NULL)
            {
                LogError("unable to copy CloneDiagnosticPropertyData");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->outputName != NULL && mallocAndStrcpy_s(&result->outputName, source->outputName) != 0)
            {
                LogError("unable to copy outputName");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->inputName != NULL && mallocAndStrcpy_s(&result->inputName, source->inputName) != 0)
            {
                LogError("unable to copy inputName");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->creationTimeUtc != NULL && mallocAndStrcpy_s(&result->creationTimeUtc, source->creationTimeUtc) != 0)
            {
                LogError("unable to copy creationTimeUtc");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->userId != NULL && mallocAndStrcpy_s(&result->userId, source->userId) != 0)
            {
                LogError("unable to copy userId");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->connectionModuleId != NULL && mallocAndStrcpy_s(&result->connectionModuleId, source->connectionModuleId) != 0)
            {
                LogError("unable to copy inputName");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->connectionDeviceId != NULL && mallocAndStrcpy_s(&result->connectionDeviceId, source->connectionDeviceId) != 0)
            {
                LogError("unable to copy inputName");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->componentName != NULL && mallocAndStrcpy_s(&result->componentName, source->componentName) != 0)
            {
                LogError("unable to copy componentName");
                DestroyMessageData(result);
                result = NULL;
            }
            else if (source->contentType == IOTHUBMESSAGE_BYTEARRAY)
            {
                if ((result->value.byteArray = BUFFER_clone(source->value.byteArray)) == NULL)
                {
                    LogError("unable to BUFFER_clone");
                    DestroyMessageData(result);
                    result = NULL;
                }
                else if ((result->properties = Map_Clone(source->properties)) == NULL)
                {
                    LogError("unable to Map_Clone");
                    DestroyMessageData(result);
                    result = NULL;
                }
            }
            else /*can only be STRING*/
            {
                if ((result->value.string = STRING_clone(source->value.string)) == NULL)
                {
                    LogError("failed to STRING_clone");
                    DestroyMessageData(result);
                    result = NULL;
                }
                else if ((result->properties = Map_Clone(source->properties)) == NULL)
                {
                    LogError("unable to Map_Clone");
                    DestroyMessageData(result);
                    result = NULL;
                }
            }
        }
    }
    return result;
}